

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif.cpp
# Opt level: O2

void __thiscall
Potassco::AspifOutput::theoryAtom(AspifOutput *this,Id_t atomOrZero,Id_t termId,IdSpan *elements)

{
  startDir(this,(Directive_t)0x9);
  add(this,5);
  add(this,atomOrZero);
  add(this,termId);
  add(this,elements);
  endDir(this);
  return;
}

Assistant:

void AspifOutput::theoryAtom(Id_t atomOrZero, Id_t termId, const IdSpan& elements) {
	startDir(Directive_t::Theory).add(Theory_t::Atom).add(atomOrZero).add(termId).add(elements).endDir();
}